

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
keys_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(keys_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_reference this_00;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this_01;
  reference this_02;
  key_type *pkVar4;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RSI;
  error_code *in_RDI;
  value_type vVar6;
  key_type s;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *item;
  iterator __end0;
  iterator __begin0;
  object_range_type *__range3;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  value_type *result;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffffed8;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffffee0;
  error_code *this_03;
  wstring local_e8 [16];
  semantic_tag *in_stack_ffffffffffffff28;
  wchar_t **in_stack_ffffffffffffff30;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffff80;
  
  this_03 = in_RDI;
  sVar2 = std::
          vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RDX);
  function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  arity(in_RSI);
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x626cf9);
  if (sVar2 == *puVar3) {
    this_00 = std::
              vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::operator[](in_RDX,0);
    parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
              (this_00);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffed8);
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RSI
                      );
    if (bVar1) {
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,0,
                 in_RSI + 1);
      std::
      vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::size(in_RDX);
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_03,
                 (size_t)in_RDI);
      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80._M_current);
      range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
      ::begin((range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
               *)&stack0xffffffffffffff80);
      range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
      ::end((range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
             *)&stack0xffffffffffffff80);
      while (bVar1 = jsoncons::detail::
                     random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                     ::operator!=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8), bVar1) {
        this_02 = jsoncons::detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                               *)0x626eb0);
        pkVar4 = key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::key(this_02);
        std::__cxx11::wstring::wstring(local_e8,(wstring *)pkVar4);
        std::__cxx11::wstring::c_str();
        basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<wchar_t_const*,jsoncons::semantic_tag>
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_02,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::__cxx11::wstring::~wstring(local_e8);
        jsoncons::detail::
        random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
        ::operator++(in_stack_fffffffffffffee0);
      }
    }
    else {
      std::error_code::operator=(this_03,(jsonpath_errc)((ulong)in_RDI >> 0x20));
      this_01 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (this_01,(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffed8);
    }
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x626f8c);
    uVar5 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(this_03,(jsonpath_errc)((ulong)in_RDI >> 0x20));
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffed8);
    uVar5 = extraout_RDX;
  }
  vVar6.field_0.int64_.val_ = uVar5;
  vVar6.field_0._0_8_ = this_03;
  return (value_type)vVar6.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0 = args[0].value();
            if (!arg0.is_object())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            value_type result(json_array_arg, semantic_tag::none, alloc_);
            result.reserve(args.size());

            for (auto& item : arg0.object_range())
            {
                auto s = item.key();
                result.emplace_back(s.c_str(), semantic_tag::none);
            }
            return result;
        }